

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O3

void __thiscall
QEGLPlatformContext::QEGLPlatformContext
          (QEGLPlatformContext *this,QSurfaceFormat *format,QPlatformOpenGLContext *share,
          EGLDisplay display,EGLConfig *config,Flags flags)

{
  QSurfaceFormat *this_00;
  EGLDisplay pvVar1;
  QTextStream *this_01;
  QDebug this_02;
  bool bVar2;
  bool bVar3;
  RenderableType RVar4;
  int iVar5;
  OpenGLContextProfile OVar6;
  QSurfaceFormat *referenceFormat;
  QPlatformOpenGLContextPrivate *pQVar7;
  EGLContext pvVar8;
  pointer ppvVar9;
  EGLenum EVar10;
  QEGLPlatformContext *pQVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  EGLint numConfigs;
  undefined1 local_b0 [12];
  undefined8 uStack_a4;
  undefined4 local_9c;
  char *local_98;
  QDebug local_90;
  QSurfaceFormat local_88;
  QDebug local_80;
  QArrayDataPointer<int> local_78;
  QList<void_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformOpenGLContext::QPlatformOpenGLContext(&this->super_QPlatformOpenGLContext);
  (this->super_QPlatformOpenGLContext)._vptr_QPlatformOpenGLContext =
       (_func_int **)&PTR__QEGLPlatformContext_007e2208;
  (this->super_QEGLContext)._vptr_QEGLContext = (_func_int **)&PTR__QEGLPlatformContext_007e22c0;
  this->m_eglDisplay = display;
  this_00 = &this->m_format;
  QSurfaceFormat::QSurfaceFormat(this_00);
  this->m_swapInterval = -1;
  this->m_swapIntervalEnvChecked = false;
  this->m_swapIntervalFromEnv = -1;
  (this->m_flags).super_QFlagsStorageHelper<QEGLPlatformContext::Flag,_4>.
  super_QFlagsStorage<QEGLPlatformContext::Flag>.i =
       (Int)flags.super_QFlagsStorageHelper<QEGLPlatformContext::Flag,_4>.
            super_QFlagsStorage<QEGLPlatformContext::Flag>.i;
  this->m_ownsContext = true;
  (this->m_contextAttrs).d.d = (Data *)0x0;
  (this->m_contextAttrs).d.ptr = (int *)0x0;
  *(undefined8 *)((long)&(this->m_contextAttrs).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(this->m_contextAttrs).d.size + 1) = 0;
  if (config == (EGLConfig *)0x0) {
    referenceFormat = (QSurfaceFormat *)q_configFromGLFormat(display,format,false,4);
  }
  else {
    referenceFormat = (QSurfaceFormat *)*config;
  }
  this->m_eglConfig = referenceFormat;
  q_glFormatFromConfig((QSurfaceFormat *)local_b0,this->m_eglDisplay,referenceFormat);
  QSurfaceFormat::operator=(this_00,(QSurfaceFormat *)local_b0);
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)local_b0);
  if (share == (QPlatformOpenGLContext *)0x0) {
    pQVar7 = (QPlatformOpenGLContextPrivate *)0x0;
  }
  else {
    pQVar7 = share[1].d_ptr.d;
  }
  this->m_shareContext = pQVar7;
  local_78.d = (Data *)0x0;
  local_78.ptr = (int *)0x0;
  local_78.size = 0;
  local_b0._0_4_ = 0x3098;
  QtPrivate::QPodArrayOps<int>::emplace<int&>((QPodArrayOps<int> *)&local_78,0,(int *)local_b0);
  QList<int>::end((QList<int> *)&local_78);
  local_b0._0_4_ = QSurfaceFormat::majorVersion(format);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)&local_78,local_78.size,(int *)local_b0);
  QList<int>::end((QList<int> *)&local_78);
  bVar2 = q_hasEglExtension(this->m_eglDisplay,"EGL_KHR_create_context");
  if (!bVar2) goto LAB_00609b88;
  local_b0._0_4_ = 0x30fb;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)&local_78,local_78.size,(int *)local_b0);
  QList<int>::end((QList<int> *)&local_78);
  local_b0._0_4_ = QSurfaceFormat::minorVersion(format);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)&local_78,local_78.size,(int *)local_b0);
  QList<int>::end((QList<int> *)&local_78);
  bVar2 = QSurfaceFormat::testOption(format,DebugContext);
  RVar4 = QSurfaceFormat::renderableType(this_00);
  if ((RVar4 == OpenGL) && (iVar5 = QSurfaceFormat::majorVersion(format), 2 < iVar5)) {
    bVar3 = QSurfaceFormat::testOption(format,DeprecatedFunctions);
    iVar5 = 1;
    if (!bVar3) {
      iVar5 = bVar2 + 2;
    }
    if (bVar2 || !bVar3) {
LAB_00609ad3:
      local_b0._0_4_ = 0x30fc;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&local_78,local_78.size,(int *)local_b0);
      QList<int>::end((QList<int> *)&local_78);
      local_b0._0_4_ = iVar5;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&local_78,local_78.size,(int *)local_b0);
      QList<int>::end((QList<int> *)&local_78);
    }
  }
  else {
    iVar5 = 1;
    if (bVar2) goto LAB_00609ad3;
  }
  RVar4 = QSurfaceFormat::renderableType(this_00);
  if (RVar4 == OpenGL) {
    local_b0._0_4_ = 0x30fd;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&local_78,local_78.size,(int *)local_b0);
    QList<int>::end((QList<int> *)&local_78);
    OVar6 = QSurfaceFormat::profile(format);
    local_b0._0_4_ = (OVar6 != CoreProfile) + 1;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&local_78,local_78.size,(int *)local_b0);
    QList<int>::end((QList<int> *)&local_78);
  }
LAB_00609b88:
  bVar2 = QSurfaceFormat::testOption(format,ProtectedContent);
  if (bVar2) {
    bVar2 = q_hasEglExtension(this->m_eglDisplay,"EGL_EXT_protected_content");
    if (bVar2) {
      local_b0._0_4_ = 0x32c0;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&local_78,local_78.size,(int *)local_b0);
      QList<int>::end((QList<int> *)&local_78);
      local_b0._0_4_ = 1;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&local_78,local_78.size,(int *)local_b0);
      QList<int>::end((QList<int> *)&local_78);
    }
    else {
      QSurfaceFormat::setOption(this_00,ProtectedContent,false);
    }
  }
  RVar4 = QSurfaceFormat::renderableType(this_00);
  if (RVar4 == OpenVG) {
    local_b0._0_4_ = 0x303e;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&local_78,local_78.size,(int *)local_b0);
    QList<int>::end((QList<int> *)&local_78);
    local_b0._0_4_ = 8;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&local_78,local_78.size,(int *)local_b0);
    QList<int>::end((QList<int> *)&local_78);
  }
  local_b0._0_4_ = 0x3038;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)&local_78,local_78.size,(int *)local_b0);
  QList<int>::end((QList<int> *)&local_78);
  QArrayDataPointer<int>::operator=(&(this->m_contextAttrs).d,&local_78);
  RVar4 = QSurfaceFormat::renderableType(this_00);
  EVar10 = 0x30a1;
  if (RVar4 != OpenVG) {
    EVar10 = (uint)(RVar4 == OpenGL) * 2 + 0x30a0;
  }
  this->m_api = EVar10;
  eglBindAPI();
  pQVar11 = (QEGLPlatformContext *)this->m_eglDisplay;
  pvVar8 = (EGLContext)eglCreateContext(pQVar11,this->m_eglConfig,this->m_shareContext,local_78.ptr)
  ;
  this->m_eglContext = pvVar8;
  if ((pvVar8 == (EGLContext)0x0) && (this->m_shareContext != (EGLContext)0x0)) {
    this->m_shareContext = (EGLContext)0x0;
    pQVar11 = (QEGLPlatformContext *)this->m_eglDisplay;
    pvVar8 = (EGLContext)eglCreateContext(pQVar11,this->m_eglConfig,0,local_78.ptr);
    this->m_eglContext = pvVar8;
  }
  if (pvVar8 == (EGLContext)0x0) {
    QEGLPlatformContext(pQVar11);
  }
  else {
    if (QEGLPlatformContext(QSurfaceFormat_const&,QPlatformOpenGLContext*,void*,void**,QFlags<QEGLPlatformContext::Flag>)
        ::printConfig == '\0') {
      QEGLPlatformContext(pQVar11);
    }
    if (QEGLPlatformContext::printConfig == true) {
      local_b0._0_4_ = 2;
      local_b0._4_8_ = 0;
      uStack_a4 = 0;
      local_9c = 0;
      local_98 = "default";
      QMessageLogger::debug();
      this_02.stream = local_90.stream;
      QVar13.m_data = (storage_type *)0x1a;
      QVar13.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar13);
      QTextStream::operator<<(&(this_02.stream)->ts,(QString *)&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((local_90.stream)->space == true) {
        QTextStream::operator<<(&(local_90.stream)->ts,' ');
      }
      (local_90.stream)->ref = (local_90.stream)->ref + 1;
      ::operator<<((Stream *)&local_80,&local_88);
      this_01 = (QTextStream *)CONCAT44(local_80.stream._4_4_,(uint)local_80.stream);
      QVar14.m_data = &DAT_0000000c;
      QVar14.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar14);
      QTextStream::operator<<(this_01,(QString *)&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (((QTextStream *)CONCAT44(local_80.stream._4_4_,(uint)local_80.stream))[0x30] ==
          (QTextStream)0x1) {
        QTextStream::operator<<
                  ((QTextStream *)CONCAT44(local_80.stream._4_4_,(uint)local_80.stream),' ');
      }
      QDebug::~QDebug(&local_80);
      QDebug::~QDebug((QDebug *)&local_88);
      QDebug::~QDebug(&local_90);
      pQVar11 = (QEGLPlatformContext *)this->m_eglDisplay;
      q_printEglConfig(pQVar11,this->m_eglConfig);
      if (QEGLPlatformContext(QSurfaceFormat_const&,QPlatformOpenGLContext*,void*,void**,QFlags<QEGLPlatformContext::Flag>)
          ::printAllConfigs == '\0') {
        QEGLPlatformContext(pQVar11);
      }
      if (QEGLPlatformContext::printAllConfigs == true) {
        local_80.stream._0_4_ = 0;
        eglGetConfigs(this->m_eglDisplay,0,0,&local_80);
        local_58.d.d = (Data *)0x0;
        local_58.d.ptr = (void **)0x0;
        local_58.d.size = 0;
        QList<void_*>::resize(&local_58,(long)(int)(uint)local_80.stream);
        pvVar1 = this->m_eglDisplay;
        ppvVar9 = QList<void_*>::data(&local_58);
        eglGetConfigs(pvVar1,ppvVar9,(uint)local_80.stream,&local_80);
        local_b0._0_4_ = 2;
        local_b0._4_8_ = 0;
        uStack_a4 = 0;
        local_9c = 0;
        local_98 = "default";
        QMessageLogger::debug(local_b0,"\nAll EGLConfigs: count=%d",(ulong)(uint)local_80.stream);
        if (0 < (int)(uint)local_80.stream) {
          uVar12 = 0;
          do {
            local_b0._0_4_ = 2;
            local_b0._4_8_ = 0;
            uStack_a4 = 0;
            local_9c = 0;
            local_98 = "default";
            QMessageLogger::debug(local_b0,"EGLConfig #%d",uVar12 & 0xffffffff);
            pvVar1 = this->m_eglDisplay;
            ppvVar9 = QList<void_*>::data(&local_58);
            q_printEglConfig(pvVar1,ppvVar9[uVar12]);
            uVar12 = uVar12 + 1;
          } while ((long)uVar12 < (long)(int)(uint)local_80.stream);
        }
        local_b0._0_4_ = 2;
        local_b0._4_8_ = 0;
        uStack_a4 = 0;
        local_9c = 0;
        local_98 = "default";
        QMessageLogger::debug(local_b0,"\n");
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
          }
        }
      }
    }
  }
  if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QEGLPlatformContext::QEGLPlatformContext(const QSurfaceFormat &format, QPlatformOpenGLContext *share, EGLDisplay display,
                                         EGLConfig *config, Flags flags)
    : m_eglDisplay(display)
    , m_flags(flags)
    , m_ownsContext(true)
{
    m_eglConfig = config ? *config : q_configFromGLFormat(display, format);

    m_format = q_glFormatFromConfig(m_eglDisplay, m_eglConfig, format);
    // m_format now has the renderableType() resolved (it cannot be Default anymore)
    // but does not yet contain version, profile, options.
    m_shareContext = share ? static_cast<QEGLPlatformContext *>(share)->m_eglContext : nullptr;

    QList<EGLint> contextAttrs;
    contextAttrs.append(EGL_CONTEXT_CLIENT_VERSION);
    contextAttrs.append(format.majorVersion());
    const bool hasKHRCreateContext = q_hasEglExtension(m_eglDisplay, "EGL_KHR_create_context");
    if (hasKHRCreateContext) {
        contextAttrs.append(EGL_CONTEXT_MINOR_VERSION_KHR);
        contextAttrs.append(format.minorVersion());
        int flags = 0;
        // The debug bit is supported both for OpenGL and OpenGL ES.
        if (format.testOption(QSurfaceFormat::DebugContext))
            flags |= EGL_CONTEXT_OPENGL_DEBUG_BIT_KHR;
        // The fwdcompat bit is only for OpenGL 3.0+.
        if (m_format.renderableType() == QSurfaceFormat::OpenGL
            && format.majorVersion() >= 3
            && !format.testOption(QSurfaceFormat::DeprecatedFunctions))
            flags |= EGL_CONTEXT_OPENGL_FORWARD_COMPATIBLE_BIT_KHR;
        if (flags) {
            contextAttrs.append(EGL_CONTEXT_FLAGS_KHR);
            contextAttrs.append(flags);
        }
        // Profiles are OpenGL only and mandatory in 3.2+. The value is silently ignored for < 3.2.
        if (m_format.renderableType() == QSurfaceFormat::OpenGL) {
            contextAttrs.append(EGL_CONTEXT_OPENGL_PROFILE_MASK_KHR);
            contextAttrs.append(format.profile() == QSurfaceFormat::CoreProfile
                                ? EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR
                                : EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR);
        }
    }

#ifdef EGL_EXT_protected_content
    if (format.testOption(QSurfaceFormat::ProtectedContent)) {
        if (q_hasEglExtension(m_eglDisplay, "EGL_EXT_protected_content")) {
            contextAttrs.append(EGL_PROTECTED_CONTENT_EXT);
            contextAttrs.append(EGL_TRUE);
        } else {
            m_format.setOption(QSurfaceFormat::ProtectedContent, false);
        }
    }
#endif

    // Special Options for OpenVG surfaces
    if (m_format.renderableType() == QSurfaceFormat::OpenVG) {
        contextAttrs.append(EGL_ALPHA_MASK_SIZE);
        contextAttrs.append(8);
    }

    contextAttrs.append(EGL_NONE);
    m_contextAttrs = contextAttrs;

    switch (m_format.renderableType()) {
    case QSurfaceFormat::OpenVG:
        m_api = EGL_OPENVG_API;
        break;
#ifdef EGL_VERSION_1_4
    case QSurfaceFormat::OpenGL:
        m_api = EGL_OPENGL_API;
        break;
#endif // EGL_VERSION_1_4
    default:
        m_api = EGL_OPENGL_ES_API;
        break;
    }

    eglBindAPI(m_api);
    m_eglContext = eglCreateContext(m_eglDisplay, m_eglConfig, m_shareContext, contextAttrs.constData());
    if (m_eglContext == EGL_NO_CONTEXT && m_shareContext != EGL_NO_CONTEXT) {
        m_shareContext = nullptr;
        m_eglContext = eglCreateContext(m_eglDisplay, m_eglConfig, nullptr, contextAttrs.constData());
    }

    if (m_eglContext == EGL_NO_CONTEXT) {
        qWarning("QEGLPlatformContext: Failed to create context: %x", eglGetError());
        return;
    }

    static const bool printConfig = qEnvironmentVariableIntValue("QT_QPA_EGLFS_DEBUG");
    if (printConfig) {
        qDebug() << "Created context for format" << format << "with config:";
        q_printEglConfig(m_eglDisplay, m_eglConfig);

        static const bool printAllConfigs = qEnvironmentVariableIntValue("QT_QPA_EGLFS_DEBUG") > 1;
        if (printAllConfigs) {
            EGLint numConfigs = 0;
            eglGetConfigs(m_eglDisplay, nullptr, 0, &numConfigs);
            QVector<EGLConfig> configs;
            configs.resize(numConfigs);
            eglGetConfigs(m_eglDisplay, configs.data(), numConfigs, &numConfigs);
            qDebug("\nAll EGLConfigs: count=%d", numConfigs);
            for (EGLint i = 0; i < numConfigs; ++i) {
                qDebug("EGLConfig #%d", i);
                q_printEglConfig(m_eglDisplay, configs[i]);
            }
            qDebug("\n");
        }
    }

    // Cannot just call updateFormatFromGL() since it relies on virtuals. Defer it to initialize().
}